

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall
QMakeEvaluator::evaluateFeatureFile(QMakeEvaluator *this,QString *fileName,bool silent)

{
  byte bVar1;
  Entry *pEVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  FileType FVar6;
  int iVar7;
  VisitReturn VVar8;
  ProFile *pPVar9;
  QList<ProString> *this_00;
  long lVar10;
  int iVar11;
  qsizetype *pqVar12;
  uchar *puVar13;
  uchar *this_01;
  long lVar14;
  QMakeFeatureRoots *pQVar15;
  long in_FS_OFFSET;
  QLatin1String QVar16;
  QLatin1String QVar17;
  QByteArrayView QVar18;
  QAnyStringView QVar19;
  QByteArrayView QVar20;
  QAnyStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  ProString afn;
  QArrayData *local_d0 [3];
  undefined1 local_b8 [32];
  char16_t *local_98;
  undefined1 *puStack_90;
  QString local_88;
  QString local_68;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.d.d = (fileName->d).d;
  local_68.d.ptr = (fileName->d).ptr;
  local_68.d.size = (fileName->d).size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar16.m_data = (char *)0x4;
  QVar16.m_size = (qsizetype)&local_68;
  cVar4 = QString::endsWith(QVar16,0x2b331f);
  if (cVar4 == '\0') {
    QVar17.m_data = (char *)0x4;
    QVar17.m_size = (qsizetype)&local_68;
    QString::append(QVar17);
  }
  if ((this->m_featureRoots).d.ptr == (QMakeFeatureRoots *)0x0) {
    updateFeaturePaths(this);
  }
  lVar14 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if (lVar14 == 0) {
    pPVar9 = (ProFile *)0x0;
  }
  else {
    pPVar9 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar14 + -1];
  }
  if (pPVar9 == (ProFile *)0x0) {
    local_88.d.d = (Data *)0x0;
    local_88.d.ptr = (char16_t *)0x0;
    local_88.d.size = 0;
  }
  else {
    local_88.d.d = (pPVar9->m_fileName).d.d;
    local_88.d.ptr = (pPVar9->m_fileName).d.ptr;
    local_88.d.size = (pPVar9->m_fileName).d.size;
    if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_88.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  QVar22 = QMakeInternal::IoUtils::fileName(&local_88);
  QVar23 = QMakeInternal::IoUtils::fileName(&local_68);
  if (QVar22.m_size == QVar23.m_size) {
    cVar4 = QtPrivate::equalStrings(QVar22,QVar23);
    if (cVar4 == '\0') goto LAB_0027edc3;
  }
  else {
LAB_0027edc3:
    pDVar3 = local_88.d.d;
    if (local_88.d.ptr != (char16_t *)0x0) {
      local_88.d.d = (Data *)0x0;
      local_88.d.ptr = (char16_t *)0x0;
      local_88.d.size = 0;
      if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
        }
      }
    }
  }
  pQVar15 = (this->m_featureRoots).d.ptr;
  local_b8._0_8_ = local_68.d.d;
  local_b8._8_8_ = local_68.d.ptr;
  local_b8._16_8_ = local_68.d.size;
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8._24_8_ = local_88.d.d;
  local_98 = local_88.d.ptr;
  puStack_90 = (undefined1 *)local_88.d.size;
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QHash<std::pair<QString,QString>,QString>::tryEmplace_impl<std::pair<QString,QString>const&>
            (&local_50,&pQVar15->cache,(pair<QString,_QString> *)local_b8);
  pEVar2 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries;
  bVar1 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
          [(uint)local_50.iterator.i.bucket & 0x7f];
  if ((QArrayData *)local_b8._24_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._24_8_,2,0x10);
    }
  }
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  this_01 = pEVar2[bVar1].storage.data + 0x30;
  if (*(long *)(pEVar2[bVar1].storage.data + 0x38) == 0) {
    pQVar15 = (this->m_featureRoots).d.ptr;
    if ((undefined1 *)local_88.d.size != (undefined1 *)0x0) {
      QVar22 = QMakeInternal::IoUtils::pathName(&local_88);
      lVar14 = (pQVar15->paths).d.size;
      if (lVar14 != 0) {
        pqVar12 = &(((pQVar15->paths).d.ptr)->d).size;
        lVar10 = 0x100000000;
        do {
          if (QVar22.m_size == *pqVar12) {
            QVar23.m_data = (char16_t *)pqVar12[-1];
            QVar23.m_size = *pqVar12;
            cVar4 = QtPrivate::equalStrings(QVar22,QVar23);
            if (cVar4 != '\0') {
              lVar10 = lVar10 >> 0x20;
              goto LAB_0027ef73;
            }
          }
          lVar10 = lVar10 + 0x100000000;
          pqVar12 = pqVar12 + 3;
          lVar14 = lVar14 + -1;
        } while (lVar14 != 0);
      }
    }
    lVar10 = 0;
LAB_0027ef73:
    if (lVar10 < (pQVar15->paths).d.size) {
      lVar14 = lVar10 * 0x18;
      do {
        local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_50.iterator.i.d =
             (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)
             ((long)&(((pQVar15->paths).d.ptr)->d).d + lVar14);
        local_50.iterator.i.bucket = (size_t)&local_68;
        QStringBuilder<const_QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_b8,(QStringBuilder<const_QString_&,_QString_&> *)&local_50);
        FVar6 = QMakeInternal::IoUtils::fileType((QString *)local_b8);
        if (FVar6 == FileNotFound) {
          iVar11 = 0;
        }
        else {
          QString::operator=(&local_68,(QString *)local_b8);
          iVar11 = 8;
        }
        if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
          }
        }
        if (FVar6 != FileNotFound) goto LAB_0027f041;
        lVar10 = lVar10 + 1;
        lVar14 = lVar14 + 0x18;
      } while (lVar10 < (pQVar15->paths).d.size);
    }
    iVar11 = 5;
LAB_0027f041:
    iVar7 = 0;
    if (iVar11 != 5) {
      iVar7 = iVar11;
    }
    if (iVar7 != 8) {
      if (iVar7 != 0) goto LAB_0027f2e4;
      QString::operator=(&local_68,(QLatin1String)(ZEXT816(0x2a7cf1) << 0x40));
    }
    puVar13 = (uchar *)&local_68;
  }
  else {
    puVar13 = this_01;
    this_01 = (uchar *)&local_68;
  }
  QString::operator=((QString *)this_01,(QString *)puVar13);
  if ((undefined1 *)local_68.d.size == (undefined1 *)0x0) {
    pQVar15 = (QMakeFeatureRoots *)0x0;
    if (!silent) {
      QVar20.m_data = (storage_type *)0x16;
      QVar20.m_size = (qsizetype)&local_50;
      QString::fromLatin1(QVar20);
      QVar21.m_size = (size_t)&local_50;
      QVar21.field_0.m_data = local_b8;
      QString::arg_impl(QVar21,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
      message(this,0x310,(QString *)local_b8);
      if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
        }
      }
      if (local_50.iterator.i.d !=
          (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) {
        LOCK();
        ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
             ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
        }
      }
      pQVar15 = (QMakeFeatureRoots *)0x0;
    }
  }
  else {
    ProKey::ProKey((ProKey *)local_b8,"QMAKE_INTERNAL_INCLUDED_FEATURES");
    this_00 = &valuesRef(this,(ProKey *)local_b8)->super_QList<ProString>;
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
    local_98 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ProString::ProString((ProString *)local_b8,&local_68);
    pQVar15 = (QMakeFeatureRoots *)0x1;
    bVar5 = ProStringList::contains((ProStringList *)this_00,(ProString *)local_b8,CaseSensitive);
    if (bVar5) {
      if (!silent) {
        QVar18.m_data = (storage_type *)0x1b;
        QVar18.m_size = (qsizetype)local_d0;
        QString::fromLatin1(QVar18);
        QVar19.m_size = (size_t)local_d0;
        QVar19.field_0.m_data = &local_50;
        QString::arg_impl(QVar19,(int)(fileName->d).ptr,(QChar)(char16_t)(fileName->d).size);
        message(this,0x210,(QString *)&local_50);
        if (local_50.iterator.i.d !=
            (Data<QHashPrivate::Node<std::pair<QString,_QString>,_QString>_> *)0x0) {
          LOCK();
          ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
               ((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.iterator.i.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_50.iterator.i.d,2,0x10);
          }
        }
        if (local_d0[0] != (QArrayData *)0x0) {
          LOCK();
          (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_d0[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_d0[0],2,0x10);
          }
        }
      }
    }
    else {
      QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                ((QMovableArrayOps<ProString> *)this_00,(this_00->d).size,(ProString *)local_b8);
      QList<ProString>::end(this_00);
      VVar8 = evaluateFile(this,&local_68,EvalFeatureFile,(LoadFlags)0x0);
      pQVar15 = (QMakeFeatureRoots *)(ulong)VVar8;
    }
    if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
      }
    }
  }
LAB_0027f2e4:
  if (&(local_88.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_88.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_88.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (VisitReturn)pQVar15;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateFeatureFile(
        const QString &fileName, bool silent)
{
    QString fn = fileName;
    if (!fn.endsWith(QLatin1String(".prf")))
        fn += QLatin1String(".prf");

    if (!m_featureRoots)
        updateFeaturePaths();
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.lock();
#endif
    QString currFn = currentFileName();
    if (IoUtils::fileName(currFn) != IoUtils::fileName(fn))
        currFn.clear();
    // Null values cannot regularly exist in the hash, so they indicate that the value still
    // needs to be determined. Failed lookups are represented via non-null empty strings.
    QString *fnp = &m_featureRoots->cache[qMakePair(fn, currFn)];
    if (fnp->isNull()) {
#ifdef QMAKE_OVERRIDE_PRFS
        {
            QString ovrfn(QLatin1String(":/qmake/override_features/") + fn);
            if (QFileInfo::exists(ovrfn)) {
                fn = ovrfn;
                goto cool;
            }
        }
#endif
        {
            int start_root = 0;
            const QStringList &paths = m_featureRoots->paths;
            if (!currFn.isEmpty()) {
                QStringView currPath = IoUtils::pathName(currFn);
                for (int root = 0; root < paths.size(); ++root)
                    if (currPath == paths.at(root)) {
                        start_root = root + 1;
                        break;
                    }
            }
            for (int root = start_root; root < paths.size(); ++root) {
                QString fname = paths.at(root) + fn;
                if (IoUtils::exists(fname)) {
                    fn = fname;
                    goto cool;
                }
            }
        }
#ifdef QMAKE_BUILTIN_PRFS
        fn.prepend(QLatin1String(":/qmake/features/"));
        if (QFileInfo::exists(fn))
            goto cool;
#endif
        fn = QLatin1String(""); // Indicate failed lookup. See comment above.

      cool:
        *fnp = fn;
    } else {
        fn = *fnp;
    }
#ifdef PROEVALUATOR_THREAD_SAFE
    m_featureRoots->mutex.unlock();
#endif
    if (fn.isEmpty()) {
        if (!silent)
            evalError(fL1S("Cannot find feature %1").arg(fileName));
        return ReturnFalse;
    }
    ProStringList &already = valuesRef(ProKey("QMAKE_INTERNAL_INCLUDED_FEATURES"));
    ProString afn(fn);
    if (already.contains(afn)) {
        if (!silent)
            languageWarning(fL1S("Feature %1 already included").arg(fileName));
        return ReturnTrue;
    }
    already.append(afn);

#ifdef PROEVALUATOR_CUMULATIVE
    bool cumulative = m_cumulative;
    // Even when evaluating the project in cumulative mode to maximize the
    // chance of collecting all source declarations, prfs are evaluated in
    // exact mode to maximize the chance of them successfully executing
    // their programmatic function.
    m_cumulative = false;
#endif

    // The path is fully normalized already.
    VisitReturn ok = evaluateFile(fn, QMakeHandler::EvalFeatureFile, LoadProOnly);

#ifdef PROEVALUATOR_CUMULATIVE
    m_cumulative = cumulative;
    if (cumulative) {
        // As the data collected in cumulative mode is potentially total
        // garbage, yet the prfs fed with it are executed in exact mode,
        // we must ignore their results to avoid that evaluation is unduly
        // aborted.
        ok = ReturnTrue;
    }
#endif
    return ok;
}